

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O3

REF_STATUS ref_smooth_geom_edge(REF_GRID ref_grid,REF_INT node)

{
  REF_DBL *pRVar1;
  REF_CELL ref_cell;
  REF_GEOM ref_geom;
  REF_INTERP pRVar2;
  REF_ADJ pRVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  undefined8 uVar7;
  ulong uVar8;
  char *pcVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  REF_INT nodes [2];
  REF_INT id;
  REF_STATUS ref_private_macro_code_rxs;
  REF_INT sense;
  REF_BOOL geom_node1;
  REF_BOOL geom_node0;
  REF_DBL t_orig;
  REF_DBL q;
  REF_INT nnode;
  REF_BOOL geom_edge;
  REF_BOOL geom_node;
  REF_DBL max_ratio;
  REF_DBL min_ratio;
  REF_DBL t;
  REF_DBL min_uv_area;
  REF_DBL normdev;
  REF_DBL normdev_orig;
  REF_DBL r1orig;
  REF_DBL r0orig;
  REF_DBL r1;
  REF_DBL r0;
  REF_DBL t1;
  REF_DBL t0;
  REF_DBL total_force [3];
  REF_DBL tangent [3];
  REF_DBL dxyz [3];
  REF_DBL dxyz_dt [6];
  REF_DBL q_orig;
  REF_DBL xyz_orig [3];
  REF_INT edge_nodes [27];
  REF_INT local_24c;
  REF_INT local_248;
  REF_INT local_244;
  REF_NODE local_240;
  double local_238;
  REF_INT local_22c;
  double local_228;
  REF_INT local_21c;
  int local_218;
  int local_214;
  double local_210;
  REF_DBL local_208;
  int local_200;
  int local_1fc;
  int local_1f8;
  int local_1f4;
  long local_1f0;
  double local_1e8;
  undefined8 uStack_1e0;
  double local_1d0;
  REF_DBL local_1c8;
  REF_DBL local_1c0;
  double local_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  double local_198;
  double local_190;
  double local_188;
  double local_180;
  double local_178;
  double local_170;
  REF_DBL local_168 [4];
  double local_148;
  double dStack_140;
  double local_138;
  double local_128 [4];
  double local_108;
  double dStack_100;
  double local_f8;
  REF_DBL local_d0;
  REF_DBL local_c8 [4];
  REF_INT local_a8;
  REF_INT local_a4;
  REF_INT local_a0;
  
  local_240 = ref_grid->node;
  ref_cell = ref_grid->cell[0];
  ref_geom = ref_grid->geom;
  pRVar2 = ref_grid->interp;
  if ((-1 < node) &&
     (((((pRVar3 = ref_grid->cell[6]->ref_adj, node < pRVar3->nnode &&
         (pRVar3->first[(uint)node] != -1)) ||
        ((pRVar3 = ref_grid->cell[9]->ref_adj, node < pRVar3->nnode &&
         (pRVar3->first[(uint)node] != -1)))) ||
       ((pRVar3 = ref_grid->cell[10]->ref_adj, node < pRVar3->nnode &&
        (pRVar3->first[(uint)node] != -1)))) ||
      ((pRVar3 = ref_grid->cell[0xb]->ref_adj, node < pRVar3->nnode &&
       (pRVar3->first[(uint)node] != -1)))))) {
    return 0;
  }
  uVar4 = ref_geom_is_a(ref_geom,node,0,&local_1f4);
  if (uVar4 == 0) {
    uVar4 = ref_geom_is_a(ref_geom,node,1,&local_1f8);
    if (uVar4 == 0) {
      if (local_1f4 != 0) {
        pcVar9 = "geom node not allowed";
        uVar7 = 0x608;
LAB_001ebd6d:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               uVar7,"ref_smooth_geom_edge",pcVar9);
        return 1;
      }
      if (local_1f8 == 0) {
        pcVar9 = "geom edge required";
        uVar7 = 0x609;
        goto LAB_001ebd6d;
      }
      uVar4 = ref_geom_unique_id(ref_geom,node,1,&local_244);
      if (uVar4 == 0) {
        uVar4 = ref_cell_node_list_around(ref_cell,node,2,&local_1fc,&local_24c);
        if (uVar4 == 0) {
          if ((long)local_1fc != 2) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                   ,0x60d,"ref_smooth_geom_edge","expected two nodes",2,(long)local_1fc);
            return 1;
          }
          uVar4 = ref_geom_is_a(ref_geom,local_24c,0,&local_214);
          if (uVar4 == 0) {
            uVar4 = ref_geom_is_a(ref_geom,local_248,0,&local_218);
            if (uVar4 == 0) {
              local_168[0] = 0.0;
              local_168[1] = 0.0;
              local_168[2] = 0.0;
              if ((local_218 == 0) || (local_214 != 0)) {
                uVar4 = ref_smooth_add_pliant_force(local_240,node,local_24c,local_168);
                if (uVar4 == 0) {
                  if ((local_214 == 0) || (local_218 != 0)) goto LAB_001ebf11;
                  goto LAB_001ebfb3;
                }
                pcVar9 = "n0";
                uVar7 = 0x616;
              }
              else {
LAB_001ebf11:
                uVar4 = ref_smooth_add_pliant_force(local_240,node,local_248,local_168);
                if (uVar4 == 0) {
LAB_001ebfb3:
                  dVar14 = ref_grid->adapt->smooth_pliant_alpha;
                  lVar6 = 0;
                  do {
                    local_128[lVar6] = local_168[lVar6] * dVar14;
                    lVar6 = lVar6 + 1;
                  } while (lVar6 != 3);
                  local_a8 = local_24c;
                  local_a0 = local_244;
                  local_a4 = node;
                  uVar4 = ref_geom_cell_tuv(ref_geom,local_24c,&local_a8,1,&local_170,&local_21c);
                  if (uVar4 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                           ,0x627,"ref_smooth_geom_edge",(ulong)uVar4,"get t0");
                    ref_node_location(local_240,local_24c);
                    node = local_24c;
LAB_001ec0bd:
                    ref_geom_tattle(ref_geom,node);
                    return uVar4;
                  }
                  uVar4 = ref_geom_cell_tuv(ref_geom,node,&local_a8,1,&local_210,&local_21c);
                  if (uVar4 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                           ,0x62d,"ref_smooth_geom_edge",(ulong)uVar4,"get t_orig");
                    ref_node_location(local_240,node);
                    goto LAB_001ec0bd;
                  }
                  local_a8 = local_248;
                  local_a0 = local_244;
                  local_a4 = node;
                  uVar4 = ref_geom_cell_tuv(ref_geom,local_248,&local_a8,1,&local_178,&local_21c);
                  if (uVar4 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                           ,0x636,"ref_smooth_geom_edge",(ulong)uVar4,"get t1");
                    ref_node_location(local_240,local_248);
                    node = local_248;
                    goto LAB_001ec0bd;
                  }
                  uVar4 = ref_egads_eval_at(ref_geom,1,local_244,&local_210,local_c8,&local_108);
                  if (uVar4 == 0) {
                    local_138 = local_f8;
                    local_148 = local_108;
                    dStack_140 = dStack_100;
                    local_238 = local_108;
                    local_228 = dStack_100;
                    local_1e8 = local_f8;
                    uVar4 = ref_math_normalize(&local_148);
                    if (uVar4 == 0) {
                      dVar14 = SQRT(local_1e8 * local_1e8 +
                                    local_238 * local_238 + local_228 * local_228);
                      dVar15 = local_128[2] * local_138 +
                               local_128[0] * local_148 + local_128[1] * dStack_140;
                      auVar12._0_8_ = dVar14 * 1e+20;
                      auVar12._8_8_ = dVar15;
                      auVar13._8_8_ = -dVar15;
                      auVar13._0_8_ = -auVar12._0_8_;
                      auVar13 = maxpd(auVar12,auVar13);
                      if (auVar13._0_8_ <= auVar13._8_8_) {
                        pcVar9 = "unable to invert dt/dxyz";
                        uVar4 = 4;
                        uVar7 = 0x642;
                        uVar8 = 4;
                        goto LAB_001ebd2a;
                      }
                      local_1e8 = dVar15 / dVar14 + local_210;
                      uVar10 = SUB84(local_170,0);
                      uVar11 = (undefined4)((ulong)local_170 >> 0x20);
                      dVar14 = local_170;
                      if (local_178 <= local_170) {
                        dVar14 = local_178;
                      }
                      uStack_1e0 = 0;
                      if (local_1e8 < dVar14) {
                        return 0;
                      }
                      if (local_170 <= local_178) {
                        uVar10 = SUB84(local_178,0);
                        uVar11 = (undefined4)((ulong)local_178 >> 0x20);
                      }
                      if ((double)CONCAT44(uVar11,uVar10) <= local_1e8 &&
                          local_1e8 != (double)CONCAT44(uVar11,uVar10)) {
                        return 0;
                      }
                      uVar4 = ref_node_ratio(local_240,local_24c,node,&local_190);
                      if (uVar4 == 0) {
                        uVar4 = ref_node_ratio(local_240,local_248,node,&local_198);
                        if (uVar4 == 0) {
                          if ((ref_grid->surf == 0) &&
                             (uVar4 = ref_smooth_tet_quality_around(ref_grid,node,&local_d0),
                             uVar4 != 0)) {
                            pcVar9 = "q_orig";
                            uVar7 = 0x655;
                          }
                          else {
                            uVar4 = ref_smooth_tri_normdev_around(ref_grid,node,&local_1a0);
                            if (uVar4 == 0) {
                              local_22c = -1;
                              local_1f0 = (long)node;
                              if ((pRVar2 != (REF_INTERP)0x0) && (pRVar2->continuously != 0)) {
                                local_22c = pRVar2->cell[local_1f0];
                              }
                              local_1d0 = local_1a0;
                              local_200 = 8;
                              uVar4 = 0;
                              local_228 = 1.0;
                              do {
                                local_1b8 = local_228 * local_1e8 + (1.0 - local_228) * local_210;
                                uVar5 = ref_geom_add(ref_geom,node,1,local_244,&local_1b8);
                                if (uVar5 != 0) {
                                  pcVar9 = "set t";
                                  uVar7 = 0x66a;
LAB_001ec8c8:
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                         ,uVar7,"ref_smooth_geom_edge",(ulong)uVar5,pcVar9);
                                  return uVar5;
                                }
                                uVar5 = ref_geom_constrain(ref_grid,node);
                                if (uVar5 != 0) {
                                  pcVar9 = "constrain";
                                  uVar7 = 0x66b;
                                  goto LAB_001ec8c8;
                                }
                                uVar5 = ref_metric_interpolate_node(ref_grid,node);
                                local_238 = (double)CONCAT44(local_238._4_4_,uVar5);
                                if ((uVar5 != 0) && (uVar5 != 5)) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                         ,0x66d,"ref_smooth_geom_edge",(ulong)uVar5,
                                         "ref_metric_interpolate_node failed");
                                  uVar4 = uVar5;
                                }
                                if ((local_238._0_4_ != 5) && (local_238._0_4_ != 0)) {
                                  return uVar4;
                                }
                                uVar5 = ref_node_ratio(local_240,local_24c,node,&local_180);
                                if (uVar5 != 0) {
                                  pcVar9 = "get r0";
                                  uVar7 = 0x66e;
                                  goto LAB_001ec8c8;
                                }
                                uVar5 = ref_node_ratio(local_240,local_248,node,&local_188);
                                if (uVar5 != 0) {
                                  pcVar9 = "get r1";
                                  uVar7 = 0x66f;
                                  goto LAB_001ec8c8;
                                }
                                if (ref_grid->surf == 0) {
                                  uVar5 = ref_smooth_tet_quality_around(ref_grid,node,&local_208);
                                  if (uVar5 != 0) {
                                    pcVar9 = "q";
                                    uVar7 = 0x675;
                                    goto LAB_001ec8c8;
                                  }
                                  uVar5 = ref_smooth_tet_ratio_around
                                                    (ref_grid,node,&local_1c0,&local_1c8);
                                  if (uVar5 != 0) {
                                    pcVar9 = "ratio";
                                    uVar7 = 0x677;
                                    goto LAB_001ec8c8;
                                  }
                                }
                                else {
                                  local_208 = 1.0;
                                  uVar5 = ref_smooth_tri_ratio_around
                                                    (ref_grid,node,&local_1c0,&local_1c8);
                                  if (uVar5 != 0) {
                                    pcVar9 = "ratio";
                                    uVar7 = 0x673;
                                    goto LAB_001ec8c8;
                                  }
                                }
                                uVar5 = ref_smooth_tri_normdev_around(ref_grid,node,&local_1a8);
                                if (uVar5 != 0) {
                                  pcVar9 = "nd";
                                  uVar7 = 0x679;
                                  goto LAB_001ec8c8;
                                }
                                uVar5 = ref_smooth_tri_uv_area_around(ref_grid,node,&local_1b0);
                                if (uVar5 != 0) {
                                  pcVar9 = "a";
                                  uVar7 = 0x67a;
                                  goto LAB_001ec8c8;
                                }
                                pRVar1 = &ref_grid->adapt->smooth_min_quality;
                                if ((*pRVar1 <= local_208 && local_208 != *pRVar1) &&
                                   (((pRVar1 = &ref_grid->adapt->post_min_normdev,
                                     *pRVar1 <= local_1a8 && local_1a8 != *pRVar1 ||
                                     (local_1d0 < local_1a8)) &&
                                    (local_240->min_uv_area <= local_1b0 &&
                                     local_1b0 != local_240->min_uv_area)))) {
                                  uVar10 = SUB84(local_180,0);
                                  uVar11 = (undefined4)((ulong)local_180 >> 0x20);
                                  dVar14 = local_180;
                                  if (local_188 <= local_180) {
                                    dVar14 = local_188;
                                  }
                                  dVar15 = local_190;
                                  if (local_198 <= local_190) {
                                    dVar15 = local_198;
                                  }
                                  if (dVar15 * 0.9 < dVar14) {
                                    if (local_180 <= local_188) {
                                      uVar10 = SUB84(local_188,0);
                                      uVar11 = (undefined4)((ulong)local_188 >> 0x20);
                                    }
                                    dVar14 = local_190;
                                    if (local_190 <= local_198) {
                                      dVar14 = local_198;
                                    }
                                    if ((double)CONCAT44(uVar11,uVar10) <= dVar14 * 1.1 &&
                                        dVar14 * 1.1 != (double)CONCAT44(uVar11,uVar10)) {
                                      return 0;
                                    }
                                  }
                                }
                                local_228 = local_228 * 0.5;
                                if (local_238._0_4_ != 0 && local_22c != -1) {
                                  pRVar2->cell[local_1f0] = local_22c;
                                }
                                local_200 = local_200 + -1;
                                if (local_200 == 0) {
                                  uVar5 = ref_geom_add(ref_geom,node,1,local_244,&local_210);
                                  if (uVar5 == 0) {
                                    uVar5 = ref_geom_constrain(ref_grid,node);
                                    if (uVar5 == 0) {
                                      uVar5 = ref_metric_interpolate_node(ref_grid,node);
                                      if ((uVar5 != 0) && (uVar5 != 5)) {
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                               ,0x68e,"ref_smooth_geom_edge",(ulong)uVar5,"interp");
                                        uVar4 = uVar5;
                                      }
                                      if ((uVar5 != 5) && (uVar5 != 0)) {
                                        return uVar4;
                                      }
                                      if (ref_grid->surf != 0) {
                                        return 0;
                                      }
                                      uVar4 = ref_smooth_tet_quality_around
                                                        (ref_grid,node,&local_208);
                                      if (uVar4 != 0) {
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                               ,0x693,"ref_smooth_geom_edge",(ulong)uVar4,"q");
                                        return uVar4;
                                      }
                                      return 0;
                                    }
                                    pcVar9 = "constrain";
                                    uVar7 = 0x68d;
                                  }
                                  else {
                                    pcVar9 = "set t";
                                    uVar7 = 0x68c;
                                  }
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                         ,uVar7,"ref_smooth_geom_edge",(ulong)uVar5,pcVar9);
                                  return uVar5;
                                }
                              } while( true );
                            }
                            pcVar9 = "nd_orig";
                            uVar7 = 0x657;
                          }
                        }
                        else {
                          pcVar9 = "get r1";
                          uVar7 = 0x651;
                        }
                      }
                      else {
                        pcVar9 = "get r0";
                        uVar7 = 0x650;
                      }
                    }
                    else {
                      pcVar9 = "form tangent";
                      uVar7 = 0x63d;
                    }
                  }
                  else {
                    pcVar9 = "eval edge derivatives";
                    uVar7 = 0x63a;
                  }
                }
                else {
                  pcVar9 = "n1";
                  uVar7 = 0x619;
                }
              }
            }
            else {
              pcVar9 = "node1";
              uVar7 = 0x611;
            }
          }
          else {
            pcVar9 = "node0";
            uVar7 = 0x610;
          }
        }
        else {
          pcVar9 = "edge neighbors";
          uVar7 = 0x60c;
        }
      }
      else {
        pcVar9 = "get id";
        uVar7 = 0x60b;
      }
    }
    else {
      pcVar9 = "edge check";
      uVar7 = 0x607;
    }
  }
  else {
    pcVar9 = "node check";
    uVar7 = 0x606;
  }
  uVar8 = (ulong)uVar4;
LAB_001ebd2a:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",uVar7,
         "ref_smooth_geom_edge",uVar8,pcVar9);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_geom_edge(REF_GRID ref_grid, REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL edg = ref_grid_edg(ref_grid);
  REF_BOOL geom_node, geom_node0, geom_node1, geom_edge;
  REF_INT id;
  REF_INT nodes[2], nnode;
  REF_DBL t_orig, t0, t1;
  REF_DBL r0, r1, r0orig, r1orig;
  REF_DBL q_orig;
  REF_DBL normdev_orig, normdev;
  REF_DBL min_uv_area;

  REF_INT ixyz;
  REF_DBL total_force[3];
  REF_DBL dxyz[3], dxyz_dt[6], xyz_orig[3], dt, dt_ds, tangent[3];

  REF_DBL t, q, backoff, t_target, min_ratio, max_ratio;
  REF_INT tries;
  REF_BOOL verbose = REF_FALSE;
  REF_INT edge_nodes[REF_CELL_MAX_SIZE_PER], sense;

  REF_STATUS interp_status;
  REF_INT interp_guess;
  REF_INTERP ref_interp = ref_grid_interp(ref_grid);
  REF_BOOL accept;

  if (!ref_cell_node_empty(ref_grid_qua(ref_grid), node)) return REF_SUCCESS;
  if (!ref_cell_node_empty(ref_grid_pyr(ref_grid), node)) return REF_SUCCESS;
  if (!ref_cell_node_empty(ref_grid_pri(ref_grid), node)) return REF_SUCCESS;
  if (!ref_cell_node_empty(ref_grid_hex(ref_grid), node)) return REF_SUCCESS;

  RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_NODE, &geom_node), "node check");
  RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_EDGE, &geom_edge), "edge check");
  RAS(!geom_node, "geom node not allowed");
  RAS(geom_edge, "geom edge required");

  RSS(ref_geom_unique_id(ref_geom, node, REF_GEOM_EDGE, &id), "get id");
  RSS(ref_cell_node_list_around(edg, node, 2, &nnode, nodes), "edge neighbors");
  REIS(2, nnode, "expected two nodes");

  /* if node0 or node1 constrained by geometry, give precedence */
  RSS(ref_geom_is_a(ref_geom, nodes[0], REF_GEOM_NODE, &geom_node0), "node0");
  RSS(ref_geom_is_a(ref_geom, nodes[1], REF_GEOM_NODE, &geom_node1), "node1");

  for (ixyz = 0; ixyz < 3; ixyz++) total_force[ixyz] = 0.0;
  if (!geom_node1 || (geom_node0 && geom_node1))
    RSS(ref_smooth_add_pliant_force(ref_node, node, nodes[0], total_force),
        "n0");
  if (!geom_node0 || (geom_node0 && geom_node1))
    RSS(ref_smooth_add_pliant_force(ref_node, node, nodes[1], total_force),
        "n1");

  for (ixyz = 0; ixyz < 3; ixyz++)
    dxyz[ixyz] =
        ref_grid_adapt(ref_grid, smooth_pliant_alpha) * total_force[ixyz];

  edge_nodes[0] = nodes[0];
  edge_nodes[1] = node;
  edge_nodes[2] = id;
  RSB(ref_geom_cell_tuv(ref_geom, nodes[0], edge_nodes, REF_GEOM_EDGE, &t0,
                        &sense),
      "get t0", {
        ref_node_location(ref_node, nodes[0]);
        ref_geom_tattle(ref_geom, nodes[0]);
      });
  RSB(ref_geom_cell_tuv(ref_geom, node, edge_nodes, REF_GEOM_EDGE, &t_orig,
                        &sense),
      "get t_orig", {
        ref_node_location(ref_node, node);
        ref_geom_tattle(ref_geom, node);
      });
  edge_nodes[0] = nodes[1];
  edge_nodes[1] = node;
  edge_nodes[2] = id;
  RSB(ref_geom_cell_tuv(ref_geom, nodes[1], edge_nodes, REF_GEOM_EDGE, &t1,
                        &sense),
      "get t1", {
        ref_node_location(ref_node, nodes[1]);
        ref_geom_tattle(ref_geom, nodes[1]);
      });

  RSS(ref_egads_eval_at(ref_geom, REF_GEOM_EDGE, id, &t_orig, xyz_orig,
                        dxyz_dt),
      "eval edge derivatives");
  for (ixyz = 0; ixyz < 3; ixyz++) tangent[ixyz] = dxyz_dt[ixyz];
  dt_ds = sqrt(ref_math_dot(dxyz_dt, dxyz_dt));
  RSS(ref_math_normalize(tangent), "form tangent");
  dt = ref_math_dot(dxyz, tangent);
  if (ref_math_divisible(dt, dt_ds)) {
    dt /= dt_ds;
  } else {
    RSS(REF_DIV_ZERO, "unable to invert dt/dxyz");
  }
  t_target = t_orig + dt;

  /* reject a smooth point candidate outside of trange */
  if (t_target < MIN(t0, t1) || MAX(t0, t1) < t_target) {
    return REF_SUCCESS;
  }

  if (verbose) {
    printf("dxyz %f %f %f\n", dxyz[0], dxyz[1], dxyz[2]);
    printf("dxyz_dt %f %f %f\n", dxyz_dt[0], dxyz_dt[1], dxyz_dt[2]);
  }

  RSS(ref_node_ratio(ref_node, nodes[0], node, &r0orig), "get r0");
  RSS(ref_node_ratio(ref_node, nodes[1], node, &r1orig), "get r1");
  if (ref_grid_surf(ref_grid)) {
    q_orig = 1.0;
  } else {
    RSS(ref_smooth_tet_quality_around(ref_grid, node, &q_orig), "q_orig");
  }
  RSS(ref_smooth_tri_normdev_around(ref_grid, node, &normdev_orig), "nd_orig");
  interp_guess = REF_EMPTY;
  if (NULL != ref_interp) {
    if (ref_interp_continuously(ref_interp)) {
      interp_guess = ref_interp_cell(ref_interp, node);
    }
  }

  if (verbose) printf("edge %d t %f %f %f q %f\n", id, t0, t_orig, t1, q_orig);

  if (verbose)
    printf("t_target %f at %f %f %f\n", t_target,
           ref_node_xyz(ref_node, 0, node), ref_node_xyz(ref_node, 1, node),
           ref_node_xyz(ref_node, 2, node));

  backoff = 1.0;
  for (tries = 0; tries < 8; tries++) {
    t = backoff * t_target + (1.0 - backoff) * t_orig;

    RSS(ref_geom_add(ref_geom, node, REF_GEOM_EDGE, id, &t), "set t");
    RSS(ref_geom_constrain(ref_grid, node), "constrain");
    interp_status = ref_metric_interpolate_node(ref_grid, node);
    RXS(interp_status, REF_NOT_FOUND, "ref_metric_interpolate_node failed");
    RSS(ref_node_ratio(ref_node, nodes[0], node, &r0), "get r0");
    RSS(ref_node_ratio(ref_node, nodes[1], node, &r1), "get r1");
    if (ref_grid_surf(ref_grid)) {
      q = 1.0;
      RSS(ref_smooth_tri_ratio_around(ref_grid, node, &min_ratio, &max_ratio),
          "ratio");
    } else {
      RSS(ref_smooth_tet_quality_around(ref_grid, node, &q), "q");
      RSS(ref_smooth_tet_ratio_around(ref_grid, node, &min_ratio, &max_ratio),
          "ratio");
    }
    RSS(ref_smooth_tri_normdev_around(ref_grid, node, &normdev), "nd");
    RSS(ref_smooth_tri_uv_area_around(ref_grid, node, &min_uv_area), "a");

    accept = (q > ref_grid_adapt(ref_grid, smooth_min_quality));
    accept = accept && (normdev > ref_grid_adapt(ref_grid, post_min_normdev) ||
                        normdev > normdev_orig);
    accept = accept && (min_uv_area > ref_node_min_uv_area(ref_node));
    accept = accept && (MIN(r0, r1) > 0.9 * MIN(r0orig, r1orig));
    accept = accept && (MAX(r0, r1) < 1.1 * MAX(r0orig, r1orig));

    if (verbose) printf("t %f r %f %f q %f \n", t, r0, r1, q);
    if (accept) {
      return REF_SUCCESS;
    }
    backoff *= 0.5;
    if (REF_EMPTY != interp_guess && REF_SUCCESS != interp_status)
      ref_interp_cell(ref_interp, node) = interp_guess;
  }

  RSS(ref_geom_add(ref_geom, node, REF_GEOM_EDGE, id, &t_orig), "set t");
  RSS(ref_geom_constrain(ref_grid, node), "constrain");
  RXS(ref_metric_interpolate_node(ref_grid, node), REF_NOT_FOUND, "interp");

  if (ref_grid_surf(ref_grid)) {
    q = 1.0;
  } else {
    RSS(ref_smooth_tet_quality_around(ref_grid, node, &q), "q");
  }
  if (verbose) printf("undo q %f\n", q);

  return REF_SUCCESS;
}